

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tictactoe.cpp
# Opt level: O2

void __thiscall Game::PrintBoard(Game *this)

{
  Player PVar1;
  char cVar2;
  int i;
  long lVar3;
  ostream *poVar4;
  array<char,_9UL> symbols;
  
  symbols._M_elems[8] = '\0';
  symbols._M_elems[0] = '\0';
  symbols._M_elems[1] = '\0';
  symbols._M_elems[2] = '\0';
  symbols._M_elems[3] = '\0';
  symbols._M_elems[4] = '\0';
  symbols._M_elems[5] = '\0';
  symbols._M_elems[6] = '\0';
  symbols._M_elems[7] = '\0';
  for (lVar3 = 0; lVar3 != 9; lVar3 = lVar3 + 1) {
    PVar1 = (this->m_board)._M_elems[lVar3];
    cVar2 = 'X';
    if (PVar1 != Cross) {
      cVar2 = ' ';
    }
    if (PVar1 == Circle) {
      cVar2 = 'O';
    }
    symbols._M_elems[lVar3] = cVar2;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"     |     |     ");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"  ");
  poVar4 = std::operator<<(poVar4,symbols._M_elems[0]);
  poVar4 = std::operator<<(poVar4,"  |  ");
  poVar4 = std::operator<<(poVar4,symbols._M_elems[1]);
  poVar4 = std::operator<<(poVar4,"  |  ");
  poVar4 = std::operator<<(poVar4,symbols._M_elems[2]);
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"_____|_____|_____");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"     |     |     ");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"  ");
  poVar4 = std::operator<<(poVar4,symbols._M_elems[3]);
  poVar4 = std::operator<<(poVar4,"  |  ");
  poVar4 = std::operator<<(poVar4,symbols._M_elems[4]);
  poVar4 = std::operator<<(poVar4,"  |  ");
  poVar4 = std::operator<<(poVar4,symbols._M_elems[5]);
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"_____|_____|_____");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"     |     |     ");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"  ");
  poVar4 = std::operator<<(poVar4,symbols._M_elems[6]);
  poVar4 = std::operator<<(poVar4,"  |  ");
  poVar4 = std::operator<<(poVar4,symbols._M_elems[7]);
  poVar4 = std::operator<<(poVar4,"  |  ");
  poVar4 = std::operator<<(poVar4,symbols._M_elems[8]);
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"     |     |     ");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void PrintBoard() const noexcept {
            std::array<char, 9> symbols {};
            for (auto i = 0; i < 9; ++i) {
                symbols[i] = GetPlayerSymbol(m_board[i]);
            }

            std::cout 
                << "     |     |     " << std::endl
                << "  " << symbols[0] << "  |  " << symbols[1] << "  |  " << symbols[2] << std::endl
                << "_____|_____|_____" << std::endl
                << "     |     |     " << std::endl
                << "  " << symbols[3] << "  |  " << symbols[4] << "  |  " << symbols[5] << std::endl
                << "_____|_____|_____" << std::endl
                << "     |     |     " << std::endl
                << "  " << symbols[6] << "  |  " << symbols[7] << "  |  " << symbols[8] << std::endl
                << "     |     |     " << std::endl 
                << std::endl;
        }